

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionEuler::ComputeInertiaStiffnessMatrix
          (ChBeamSectionEuler *this,ChMatrixNM<double,_6,_6> *Ki,ChVector<double> *mWvel,
          ChVector<double> *mWacc,ChVector<double> *mXacc)

{
  double local_350;
  ChVector<double> mT;
  Matrix<double,_6,_1,_0,_6,_1> *local_328;
  Matrix<double,_6,_1,_0,_6,_1> *local_320;
  Matrix<double,_6,_1,_0,_6,_1> *local_310;
  Matrix<double,_6,_1,_0,_6,_1> *local_308;
  undefined1 local_2f8 [16];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *local_2e8 [2];
  LhsNested local_2d8;
  RhsNested pMStack_2d0;
  scalar_constant_op<double> local_2b8;
  LhsNested local_2a0;
  RhsNested pMStack_298;
  scalar_constant_op<double> local_280;
  ChVector<double> mF;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *local_250;
  LhsNested local_248;
  RhsNested pMStack_240;
  scalar_constant_op<double> local_228;
  ChVectorN<double,_6> Fi_dr;
  double local_1e8;
  undefined1 local_1e0 [32];
  variable_if_dynamic<long,__1> local_1c0;
  scalar_constant_op<double> sStack_1b8;
  Index local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  variable_if_dynamic<long,__1> vStack_178;
  scalar_constant_op<double> local_170;
  Index IStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  ChVectorN<double,_6> Fi0;
  Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false> local_118;
  ChVectorN<double,_6> *local_e0;
  Matrix<double,_6,_1,_0,_6,_1> *local_d8;
  RhsNested pMStack_d0;
  scalar_constant_op<double> local_b8;
  ChVectorN<double,_6> drFi;
  undefined1 local_78 [32];
  double local_58;
  double local_50;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  
  local_78._8_8_ = local_78._0_8_;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)Ki);
  if (this->compute_inertia_stiffness_matrix != false) {
    mF.m_data[0] = 0.0;
    mF.m_data[1] = 0.0;
    mF.m_data[2] = 0.0;
    mT.m_data[0] = 0.0;
    mT.m_data[1] = 0.0;
    mT.m_data[2] = 0.0;
    (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x11])(this,&mF,&mT,mWvel,mWacc,mXacc);
    local_78._0_8_ = &mF;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi0,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78);
    local_78._0_8_ = &mT;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78);
    local_78._16_16_ = ZEXT816(0) << 0x40;
    local_2f8 = vmovhps_avx(local_78._16_16_,0x8000000000000000);
    local_58 = 0.0;
    local_50 = -1e-08;
    dStack_48 = -0.0;
    dStack_40 = 1e-08;
    dStack_38 = 0.0;
    local_2e8[0] = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)local_78;
    local_78._0_16_ = local_2f8;
    Eigen::DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>::setOnes
              ((DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_> *)local_2e8);
    local_198._0_8_ =
         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          *)local_78;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_198,mXacc);
    (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x11])
              (this,(non_const_type)&mF,&mT,mWvel,mWacc,local_2e8);
    local_198._0_8_ = (non_const_type)&mF;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi_dr,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_198);
    local_198._0_8_ = &mT;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi_dr,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_198);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_198,&Fi0,0,3);
    Eigen::
    Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>,_0>
    ::Product((Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
               *)local_2e8,(Lhs *)local_78,(Rhs *)local_198);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_1e0,&drFi,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_1e0,
               (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
                *)local_2e8);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi0,3,3);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_198,&drFi,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_198,
               (Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8);
    local_e0 = &Fi_dr;
    local_310 = (Matrix<double,_6,_1,_0,_6,_1> *)0x4197d78400000000;
    local_d8 = &Fi0;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)local_198,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                 *)&local_e0,(double *)&local_310);
    local_328 = (Matrix<double,_6,_1,_0,_6,_1> *)0x4197d78400000000;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data =
         (PointerType)&drFi;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)&Fi0;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)local_1e0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                 *)&local_118,(double *)&local_328);
    local_2d8 = (LhsNested)local_198._8_8_;
    pMStack_2d0 = (RhsNested)local_198._16_8_;
    local_2b8.m_other = local_170.m_other;
    local_2a0 = (LhsNested)local_1e0._8_8_;
    pMStack_298 = (RhsNested)local_1e0._16_8_;
    local_280.m_other = sStack_1b8.m_other;
    Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false> *)&local_250,Ki,0,3,6,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
              ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false> *)&local_250,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                *)local_2e8);
    local_198._0_8_ = local_2f8._0_8_;
    local_198._8_8_ = local_2f8._8_8_;
    local_198._16_8_ = (RhsNested)0x3e45798ee2308c3a;
    local_198._24_8_ = (XprTypeNested)0x0;
    vStack_178.m_value = 0;
    local_170.m_other = -0.0;
    IStack_168 = -0x41ba86711dcf73c6;
    local_160 = 0;
    uStack_158 = 0;
    local_2e8[0] = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)local_198;
    Eigen::DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>::setOnes
              ((DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_> *)local_2e8);
    local_1e0._0_8_ =
         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          *)local_198;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_1e0,mXacc);
    (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x11])
              (this,(non_const_type)&mF,(non_const_type)&mT,mWvel,mWacc,local_2e8);
    local_1e0._0_8_ = (non_const_type)&mF;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi_dr,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1e0);
    local_1e0._0_8_ = (non_const_type)&mT;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi_dr,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_1e0);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_1e0,&Fi0,0,3);
    Eigen::
    Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>,_0>
    ::Product((Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
               *)local_2e8,(Lhs *)local_198,(Rhs *)local_1e0);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_250,&drFi,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_250,
               (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
                *)local_2e8);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi0,3,3);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_1e0,&drFi,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_1e0,
               (Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8);
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data =
         (PointerType)&Fi_dr;
    local_328 = (Matrix<double,_6,_1,_0,_6,_1> *)0x4197d78400000000;
    local_118.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_rows.
    m_value = (long)&Fi0;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)local_1e0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                 *)&local_118,(double *)&local_328);
    local_350 = 100000000.0;
    local_310 = &drFi;
    local_308 = &Fi0;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)&local_250,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                 *)&local_310,&local_350);
    local_2d8 = (LhsNested)local_1e0._8_8_;
    pMStack_2d0 = (RhsNested)local_1e0._16_8_;
    local_2b8.m_other = sStack_1b8.m_other;
    local_2a0 = local_248;
    pMStack_298 = pMStack_240;
    local_280.m_other = local_228.m_other;
    Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false> *)&local_e0,Ki,0,4,6,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
              ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false> *)&local_e0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                *)local_2e8);
    local_1e0._0_8_ = (non_const_type)0x0;
    local_1e0._8_8_ = -0x41ba86711dcf73c6;
    local_1e0._16_8_ = (RhsNested)0x0;
    local_1e0._24_8_ = (XprTypeNested)0x3e45798ee2308c3a;
    local_1c0.m_value = local_2f8._0_8_;
    sStack_1b8.m_other = (double)local_2f8._8_8_;
    local_1a8 = ZEXT816(0) << 0x20;
    local_1b0 = -0x8000000000000000;
    local_2e8[0] = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)local_1e0;
    Eigen::DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>::setOnes
              ((DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_> *)local_2e8);
    local_250 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)local_1e0;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_250,mXacc);
    (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x11])
              (this,(non_const_type)&mF,(non_const_type)&mT,mWvel,mWacc,local_2e8);
    local_250 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)&mF;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi_dr,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_250);
    local_250 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)&mT;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi_dr,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_250);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_250,&Fi0,0,3);
    Eigen::
    Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_1,_false>,_0>
    ::Product((Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
               *)local_2e8,(Lhs *)local_1e0,(Rhs *)&local_250);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_e0,&drFi,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,0>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_e0,
               (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>,_0>
                *)local_2e8);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_2e8,&Fi0,3,3);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&local_250,&drFi,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_250,
               (Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)local_2e8);
    local_310 = &Fi_dr;
    local_350 = 100000000.0;
    local_308 = &Fi0;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)&local_250,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                 *)&local_310,&local_350);
    local_1e8 = 100000000.0;
    local_328 = &drFi;
    local_320 = &Fi0;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)&local_e0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                 *)&local_328,&local_1e8);
    local_2d8 = local_248;
    pMStack_2d0 = pMStack_240;
    local_2b8.m_other = local_228.m_other;
    local_2a0 = local_d8;
    pMStack_298 = pMStack_d0;
    local_280.m_other = local_b8.m_other;
    Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block(&local_118,Ki,0,5,6,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
              (&local_118,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                *)local_2e8);
  }
  return;
}

Assistant:

void ChBeamSectionEuler::ComputeInertiaStiffnessMatrix(ChMatrixNM<double, 6, 6>& Ki, ///< 6x6 sectional inertial-stiffness matrix values here
		const ChVector<>& mWvel,      ///< current angular velocity of section, in material frame
		const ChVector<>& mWacc,      ///< current angular acceleration of section, in material frame
		const ChVector<>& mXacc       ///< current acceleration of section, in material frame (not absolute!)
	){
		double Delta = 1e-8; // magic number, todo: parametrize or #define
		Ki.setZero();

		if (compute_inertia_stiffness_matrix == false) 
			return;

		// We assume first three columns of Ki are null because Fi does not depend on displacement.
		// We compute Ki by numerical differentiation.

    
		ChVector<> mF, mT;
		this->ComputeInertialForce(mF, mT, mWvel, mWacc, mXacc);
		ChVectorN<double,6> Fi0;
		Fi0.segment(0, 3) = mF.eigen();
		Fi0.segment(3, 3) = mT.eigen();

   
		ChVectorN<double,6> Fi_dr;
		ChVectorN<double, 6> drFi;

		// dr_x
		ChStarMatrix33<> rot_lx(ChVector<>(Delta, 0, 0));
		rot_lx.diagonal().setOnes();
		this->ComputeInertialForce(mF, mT, 
			mWvel, // or rot_lx.transpose()*mWvel,  if abs. ang.vel is constant during rot.increments
			mWacc, // or rot_lx.transpose()*mWacc,  if abs. ang.vel is constant during rot.increments
			rot_lx.transpose()*mXacc);
		Fi_dr.segment(0, 3) = mF.eigen();
		Fi_dr.segment(3, 3) = mT.eigen();
		drFi.segment(0 , 3) = rot_lx * Fi0.segment(0, 3);
		drFi.segment(3 , 3) = Fi0.segment(3, 3);
		Ki.block(0, 3, 6, 1) = (Fi_dr - Fi0) * (1.0 / Delta) +(drFi - Fi0) * (1.0 / Delta);

		// dr_y
		ChStarMatrix33<> rot_ly(ChVector<>(0, Delta, 0));
		rot_ly.diagonal().setOnes();
		this->ComputeInertialForce(mF, mT, 
			mWvel, 
			mWacc, 
			rot_ly.transpose()*mXacc);
		Fi_dr.segment(0, 3) = mF.eigen();
		Fi_dr.segment(3, 3) = mT.eigen();
		drFi.segment(0 , 3) = rot_ly * Fi0.segment(0, 3);
		drFi.segment(3 , 3) = Fi0.segment(3, 3);
		Ki.block(0, 4, 6, 1) = (Fi_dr - Fi0) * (1.0 / Delta) +(drFi - Fi0) * (1.0 / Delta);

		// dr_z
		ChStarMatrix33<> rot_lz(ChVector<>(0, 0, Delta));
		rot_lz.diagonal().setOnes();
		this->ComputeInertialForce(mF, mT, 
			mWvel, 
			mWacc, 
			rot_lz.transpose()*mXacc);
		Fi_dr.segment(0, 3) = mF.eigen();
		Fi_dr.segment(3, 3) = mT.eigen();
		drFi.segment(0 , 3) = rot_lz * Fi0.segment(0, 3);
		drFi.segment(3 , 3) = Fi0.segment(3, 3);
		Ki.block(0, 5, 6, 1) = (Fi_dr - Fi0) * (1.0 / Delta) +(drFi - Fi0) * (1.0 / Delta);
	}